

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  ExprList *pEVar2;
  
  if (pList == (ExprList *)0x0) {
    pEVar2 = sqlite3ExprListAppendNew(pParse->db,pExpr);
    return pEVar2;
  }
  iVar1 = pList->nExpr;
  if (iVar1 < pList->nAlloc) {
    pList->nExpr = iVar1 + 1;
    pList->a[iVar1].pExpr = (Expr *)0x0;
    pList->a[iVar1].zEName = (char *)0x0;
    pList->a[iVar1].fg = (anon_struct_4_9_b482b7ef_for_fg)0x0;
    pList->a[iVar1].u = (anon_union_4_2_6146edf4_for_u)0x0;
    pList->a[iVar1].pExpr = pExpr;
    return pList;
  }
  pEVar2 = sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  return pEVar2;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  if( pList==0 ){
    return sqlite3ExprListAppendNew(pParse->db,pExpr);
  }
  if( pList->nAlloc<pList->nExpr+1 ){
    return sqlite3ExprListAppendGrow(pParse->db,pList,pExpr);
  }
  pItem = &pList->a[pList->nExpr++];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}